

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall crnlib::dxt1_endpoint_optimizer::compute_selectors_hc(dxt1_endpoint_optimizer *this)

{
  bool bVar1;
  byte bVar2;
  unique_color *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int result_4;
  uint uVar16;
  int result_3;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int result_1;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int result;
  uint uVar31;
  int iVar32;
  int iVar33;
  int result_2;
  uint uVar34;
  int iVar35;
  color_quad_u8 c1;
  color_quad_u8 c0;
  undefined1 local_98 [5];
  byte local_93;
  byte local_92;
  
  uVar31 = (this->m_unique_colors).m_size;
  uVar27 = (this->m_best_solution).m_selectors.m_size;
  if (uVar27 != uVar31) {
    if (uVar27 <= uVar31) {
      if ((this->m_best_solution).m_selectors.m_capacity < uVar31) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_best_solution).m_selectors,uVar31,
                   uVar27 + 1 == uVar31,1,(object_mover)0x0,false);
      }
      uVar27 = (this->m_best_solution).m_selectors.m_size;
      memset((this->m_best_solution).m_selectors.m_p + uVar27,0,(ulong)(uVar31 - uVar27));
    }
    (this->m_best_solution).m_selectors.m_size = uVar31;
  }
  if ((this->m_best_solution).m_enforce_selector == true) {
    memset((this->m_best_solution).m_selectors.m_p,(uint)(this->m_best_solution).m_enforced_selector
           ,(ulong)(this->m_best_solution).m_selectors.m_size);
    return;
  }
  dxt1_block::unpack_color
            ((dxt1_block *)(local_98 + 4),(this->m_best_solution).m_coords.m_low_color,true,0xff);
  dxt1_block::unpack_color
            ((dxt1_block *)local_98,(this->m_best_solution).m_coords.m_high_color,true,0xff);
  bVar1 = (this->m_best_solution).m_alternate_rounding;
  uVar31 = ((uint)local_98[0] + (uint)local_98[4] * 2 + (uint)bVar1) / 3;
  if (0xfe < uVar31) {
    uVar31 = 0xff;
  }
  uVar27 = ((uint)local_98[1] + (uint)bVar1 + (uint)local_93 * 2) / 3;
  if (0xfe < uVar27) {
    uVar27 = 0xff;
  }
  uVar34 = ((uint)local_98[2] + (uint)bVar1 + (uint)local_92 * 2) / 3;
  if (0xfe < uVar34) {
    uVar34 = 0xff;
  }
  uVar17 = ((uint)local_98[4] + (uint)local_98[0] * 2 + (uint)bVar1) / 3;
  if (0xfe < uVar17) {
    uVar17 = 0xff;
  }
  uVar16 = ((uint)local_93 + (uint)bVar1 + (uint)local_98[1] * 2) / 3;
  if (0xfe < uVar16) {
    uVar16 = 0xff;
  }
  uVar9 = ((uint)local_92 + (uint)bVar1 + (uint)local_98[2] * 2) / 3;
  uVar20 = 0xff;
  if (uVar9 < 0xff) {
    uVar20 = uVar9;
  }
  uVar15 = (ulong)(this->m_unique_colors).m_size;
  if (uVar15 != 0) {
    uVar26 = 0;
    do {
      puVar3 = (this->m_unique_colors).m_p;
      bVar8 = puVar3[uVar26].m_color.field_0.field_0.r;
      uVar9 = (uint)bVar8;
      bVar2 = puVar3[uVar26].m_color.field_0.field_0.g;
      uVar14 = (uint)bVar2;
      iVar22 = uVar9 - uVar17;
      bVar1 = this->m_perceptual;
      iVar10 = iVar22 * 8;
      if (bVar1 == false) {
        iVar10 = iVar22;
      }
      iVar18 = uVar14 - uVar16;
      iVar11 = iVar18 * 0x19;
      if (bVar1 == false) {
        iVar11 = iVar18;
      }
      iVar33 = bVar8 - uVar31;
      iVar12 = iVar33 * 8;
      if (bVar1 == false) {
        iVar12 = iVar33;
      }
      iVar32 = bVar2 - uVar27;
      iVar4 = iVar32 * 0x19;
      if (bVar1 == false) {
        iVar4 = iVar32;
      }
      iVar19 = uVar9 - local_98[0];
      iVar21 = iVar19 * 8;
      if (bVar1 == false) {
        iVar21 = iVar19;
      }
      iVar13 = uVar14 - local_98[1];
      iVar5 = iVar13 * 0x19;
      if (bVar1 == false) {
        iVar5 = iVar13;
      }
      iVar28 = uVar9 - local_98[4];
      iVar29 = iVar28 * 8;
      if (bVar1 == false) {
        iVar29 = iVar28;
      }
      iVar35 = uVar14 - local_93;
      iVar6 = iVar35 * 0x19;
      if (bVar1 == false) {
        iVar6 = iVar35;
      }
      bVar8 = puVar3[uVar26].m_color.field_0.field_0.b;
      iVar24 = (uint)bVar8 - (uint)local_92;
      uVar25 = iVar24 * iVar24 + iVar29 * iVar28 + iVar6 * iVar35;
      iVar29 = (uint)bVar8 - (uint)local_98[2];
      uVar30 = iVar29 * iVar29 + iVar21 * iVar19 + iVar5 * iVar13;
      uVar14 = (bVar8 - uVar34) * (bVar8 - uVar34) + iVar12 * iVar33 + iVar4 * iVar32;
      uVar23 = (bVar8 - uVar20) * (bVar8 - uVar20) + iVar10 * iVar22 + iVar11 * iVar18;
      uVar9 = uVar30;
      if (uVar25 < uVar30) {
        uVar9 = uVar25;
      }
      uVar7 = uVar23;
      if (uVar14 < uVar23) {
        uVar7 = uVar14;
      }
      bVar8 = uVar23 < uVar14 | 2;
      if (uVar9 <= uVar7) {
        bVar8 = uVar30 < uVar25;
      }
      (this->m_best_solution).m_selectors.m_p[uVar26] = bVar8;
      uVar26 = uVar26 + 1;
    } while (uVar15 != uVar26);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_selectors_hc()
    {
        m_best_solution.m_selectors.resize(m_unique_colors.size());
        if (m_best_solution.m_enforce_selector)
        {
            memset(m_best_solution.m_selectors.get_ptr(), m_best_solution.m_enforced_selector, m_best_solution.m_selectors.size());
            return;
        }
        color_quad_u8 c0 = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + m_best_solution.m_alternate_rounding) / 3, (c0.g * 2 + c1.g + m_best_solution.m_alternate_rounding) / 3, (c0.b * 2 + c1.b + m_best_solution.m_alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + m_best_solution.m_alternate_rounding) / 3, (c1.g * 2 + c0.g + m_best_solution.m_alternate_rounding) / 3, (c1.b * 2 + c0.b + m_best_solution.m_alternate_rounding) / 3, 0);
        for (uint i = 0, iEnd = m_unique_colors.size(); i < iEnd; i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            uint e0 = color::color_distance(m_perceptual, c, c0, false);
            uint e1 = color::color_distance(m_perceptual, c, c1, false);
            uint e2 = color::color_distance(m_perceptual, c, c2, false);
            uint e3 = color::color_distance(m_perceptual, c, c3, false);
            uint e01 = math::minimum(e0, e1);
            uint e23 = math::minimum(e2, e3);
            m_best_solution.m_selectors[i] = e01 <= e23 ? e01 == e0 ? 0 : 1 : e23 == e2 ? 2
                                                                                        : 3;
        }
    }